

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(XrSpaceUserFB *handle_to_check)

{
  iterator iVar1;
  ValidateXrHandleResult VVar2;
  UniqueLock lock;
  unique_lock<std::mutex> local_20;
  
  VVar2 = VALIDATE_XR_HANDLE_INVALID;
  if (handle_to_check != (XrSpaceUserFB *)0x0) {
    if (*handle_to_check == (XrSpaceUserFB)0x0) {
      VVar2 = VALIDATE_XR_HANDLE_NULL;
    }
    else {
      local_20._M_device =
           &g_spaceuserfb_info.super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>.
            dispatch_mutex_;
      local_20._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_20);
      local_20._M_owns = true;
      iVar1 = std::
              _Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&g_spaceuserfb_info,handle_to_check);
      VVar2 = VALIDATE_XR_HANDLE_SUCCESS -
              (iVar1.
               super__Node_iterator_base<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
               ._M_cur == (__node_type *)0x0);
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
    }
  }
  return VVar2;
}

Assistant:

ValidateXrHandleResult VerifyXrSpaceUserFBHandle(const XrSpaceUserFB* handle_to_check) {
    return g_spaceuserfb_info.verifyHandle(handle_to_check);
}